

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O1

void __thiscall Am_Depends_Iterator::Next(Am_Depends_Iterator *this)

{
  Am_Dependency_Data *pAVar1;
  
  if (this->current == (Am_Dependency_Data *)0x0) {
    if (this->context == (Am_Formula_Advanced *)0x0) goto LAB_001c645e;
    pAVar1 = (Am_Dependency_Data *)(this->context + 4);
  }
  else {
    pAVar1 = this->current + 0x10;
  }
  this->current = *(Am_Dependency_Data **)pAVar1;
LAB_001c645e:
  pAVar1 = this->current;
  while ((pAVar1 != (Am_Dependency_Data *)0x0 && (*(long *)pAVar1 == 0))) {
    pAVar1 = *(Am_Dependency_Data **)(pAVar1 + 0x10);
    this->current = pAVar1;
  }
  return;
}

Assistant:

void
Am_Depends_Iterator::Next()
{
  if (current)
    current = (Am_Dependency_Data *)((Dependency *)current)->next;
  else if (context)
    current = (Am_Dependency_Data *)((Formula_Constraint *)context)->depends_on;
  while (current && !(((Dependency *)current)->depended))
    current = (Am_Dependency_Data *)((Dependency *)current)->next;
}